

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O3

size_t file_read(png_t *png,void *out,size_t size,size_t numel)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (png->read_fun == (png_read_callback_t)0x0) {
    if (out != (void *)0x0) {
      sVar3 = fread(out,1,size,(FILE *)png->user_pointer);
      return sVar3;
    }
    iVar2 = fseek((FILE *)png->user_pointer,size,1);
    sVar4 = (size_t)iVar2;
  }
  else {
    uVar1 = (*png->read_fun)(out,1,size,png->user_pointer);
    sVar4 = (size_t)uVar1;
  }
  return sVar4;
}

Assistant:

static size_t file_read(png_t* png, void* out, size_t size, size_t numel)
{
	size_t result;
	if(png->read_fun)
	{
		result = png->read_fun(out, size, numel, png->user_pointer);
	}
	else
	{
		if(!out)
		{
			result = fseek(png->user_pointer, (long)(size*numel), SEEK_CUR);
		}
		else
		{
			result = fread(out, size, numel, png->user_pointer);
		}
	}

	return result;
}